

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lexer.cpp
# Opt level: O2

expected<Miss2Identifier,_Miss2Identifier::Error> *
Miss2Identifier::match
          (expected<Miss2Identifier,_Miss2Identifier::Error> *__return_storage_ptr__,
          string_view *value,Options *options)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  size_type __n;
  size_type sVar5;
  long lVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  basic_string_view<char,_std::char_traits<char>_> index;
  undefined1 local_78 [16];
  constexpr_optional_base<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_68;
  anon_union_16_3_1618c560_for__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_true>_3
  local_48;
  undefined8 local_38;
  
  bVar2 = is_identifier(value,options);
  if (bVar2) {
    bVar2 = true;
    sVar4 = 0;
    __n = 0xffffffffffffffff;
    for (lVar6 = 1; value->__size + lVar6 != 1; lVar6 = lVar6 + -1) {
      cVar1 = value->__data[sVar4];
      if (cVar1 == '[') {
        sVar5 = sVar4;
        if (__n != 0xffffffffffffffff) {
          __return_storage_ptr__->has_value = false;
          (__return_storage_ptr__->contained).m_error = NestingOfArrays;
          return __return_storage_ptr__;
        }
      }
      else {
        if (cVar1 == ']') {
          bVar7 = libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::substr
                            (value,0,__n);
          index = libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::substr
                            (value,__n + 1,-(lVar6 + __n));
          local_78 = (undefined1  [16])bVar7;
          if (bVar2) {
            libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>::
            to_string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                       ,&index,(allocator<char> *)&local_48._tail);
            uVar3 = std::__cxx11::stoi((string *)local_78,(size_t *)0x0,10);
            std::__cxx11::string::~string((string *)local_78);
            if ((int)uVar3 < 0) {
              __return_storage_ptr__->has_value = false;
              (__return_storage_ptr__->contained).m_error = NegativeIndex;
              return __return_storage_ptr__;
            }
            local_48._0_8_ = ZEXT48(uVar3);
            local_38 = 1;
            std::experimental::
            constexpr_optional_base<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::constexpr_optional_base
                      (&local_68,
                       (variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>
                        *)&local_48._tail);
          }
          else {
            local_48._0_8_ = index.__data;
            local_48._8_8_ = index.__size;
            local_38 = 2;
            std::experimental::
            constexpr_optional_base<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::constexpr_optional_base
                      (&local_68,
                       (variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>
                        *)&local_48._tail);
          }
          goto LAB_001b725f;
        }
        sVar5 = 0xffffffffffffffff;
        if ((__n != 0xffffffffffffffff) && (sVar5 = __n, 9 < (byte)(cVar1 - 0x30U))) {
          bVar2 = (bool)(bVar2 & cVar1 == '-');
        }
      }
      sVar4 = sVar4 + 1;
      __n = sVar5;
    }
    local_78 = *(undefined1 (*) [16])value;
    local_68.init_ = false;
    local_68.storage_.dummy_ = '\0';
LAB_001b725f:
    nonstd::expected<Miss2Identifier,_Miss2Identifier::Error>::expected<true,_0>
              (__return_storage_ptr__,(value_type *)local_78);
  }
  else {
    __return_storage_ptr__->has_value = false;
    (__return_storage_ptr__->contained).m_error = InvalidIdentifier;
  }
  return __return_storage_ptr__;
}

Assistant:

auto Miss2Identifier::match(const string_view& value, const Options& options) -> expected<Miss2Identifier, Error>
{
    size_t begin_index = std::string::npos;
    bool is_number_index = true;

    if(!Miss2Identifier::is_identifier(value, options))
        return make_unexpected(Miss2Identifier::InvalidIdentifier);

    for(size_t i = 0; i < value.size(); ++i)
    {
        if(value[i] == '[')
        {
            if(begin_index != std::string::npos)
                return make_unexpected(Miss2Identifier::NestingOfArrays);

            begin_index = i;
        }
        else if(value[i] == ']')
        {
            auto ident = value.substr(0, begin_index);
            auto index = value.substr(begin_index + 1, i - (begin_index + 1));
            try
            {
                using index_type = decltype(Miss2Identifier::index);
                if(is_number_index)
                {
                    int index_value = std::stoi(index.to_string());
                    if(index_value >= 0)
                        return Miss2Identifier{ ident, index_type(index_value) };
                    else
                        return make_unexpected(Miss2Identifier::NegativeIndex);
                }
                else
                    return Miss2Identifier{ ident, index_type(index) };
            }
            catch(const std::out_of_range&)
            {
                return make_unexpected(Miss2Identifier::OutOfRange);
            }
        }
        else if(begin_index != std::string::npos)
        {
            if(!((value[i] >= '0' && value[i] <= '9') || (value[i] == '-')))
                is_number_index = false;
        }
    }

    return Miss2Identifier{ value, nullopt };
}